

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_optional.hpp
# Opt level: O2

reference_type __thiscall
ak_toolbox::compact_optional_ns::detail_::
compact_optional_base<ak_toolbox::compact_optional_ns::evp_bool>::value
          (compact_optional_base<ak_toolbox::compact_optional_ns::evp_bool> *this)

{
  char cVar1;
  
  cVar1 = (this->super_type).value_;
  if (cVar1 != '\x02') {
    return cVar1 != '\0';
  }
  __assert("has_value()",
           "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/compact_optional.hpp"
           ,0x15f);
}

Assistant:

AK_TOOLBOX_CONSTEXPR bool has_value() const { return !N::is_empty_value(base::value_); }